

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *tab_bar;
  ImU32 tab_id;
  
  tab_bar = GImGui->CurrentTabBar;
  if ((tab_bar != (ImGuiTabBar *)0x0) && ((tab_bar->Flags & 0x100000) == 0)) {
    if (tab_bar->WantLayout != false) {
      tab_id = TabBarCalcTabID(tab_bar,label);
      TabBarRemoveTab(tab_bar,tab_id);
      return;
    }
    __assert_fail("tab_bar->WantLayout",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1c76,"void ImGui::SetTabItemClosed(const char *)");
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        IM_ASSERT(tab_bar->WantLayout);         // Needs to be called AFTER BeginTabBar() and BEFORE the first call to BeginTabItem()
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        TabBarRemoveTab(tab_bar, tab_id);
    }
}